

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::StandardRsCaseItemSyntax::getChild(StandardRsCaseItemSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  undefined8 in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  TokenOrSyntax *in_stack_ffffffffffffffa0;
  nullptr_t in_stack_ffffffffffffffa8;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x18),in_stack_ffffffffffffff98);
    break;
  case 1:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffa8;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,token);
    break;
  case 2:
    not_null<slang::syntax::RsProdItemSyntax_*>::get
              ((not_null<slang::syntax::RsProdItemSyntax_*> *)(in_RSI + 0x60));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 3:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffffa8;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,token_00);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffffa8);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax StandardRsCaseItemSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &expressions;
        case 1: return colon;
        case 2: return item.get();
        case 3: return semi;
        default: return nullptr;
    }
}